

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inproc.c
# Opt level: O3

void inproc_queue_run(inproc_queue *queue)

{
  nni_aio *aio;
  nni_aio *aio_00;
  nni_msg *m;
  size_t sVar1;
  size_t sVar2;
  nni_msg *msg;
  
  if (queue->closed == true) {
    inproc_queue_run_closed(queue);
  }
  aio = (nni_aio *)nni_list_first(&queue->readers);
  if (aio != (nni_aio *)0x0) {
    do {
      aio_00 = (nni_aio *)nni_list_first(&queue->writers);
      if (aio_00 == (nni_aio *)0x0) {
        return;
      }
      m = nni_aio_get_msg(aio_00);
      if (m == (nni_msg *)0x0) {
        nni_panic("%s: %d: assert err: %s",
                  "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/transport/inproc/inproc.c"
                  ,0x97,"msg != NULL");
      }
      nni_aio_list_remove(aio_00);
      nni_aio_set_msg(aio_00,(nni_msg *)0x0);
      sVar1 = nni_msg_len(m);
      sVar2 = nni_msg_header_len(m);
      nni_aio_finish(aio_00,NNG_OK,sVar1 + sVar2);
      msg = nni_msg_pull_up(m);
      if (msg == (nni_msg *)0x0) {
        nni_msg_free(m);
      }
      else {
        nni_aio_list_remove(aio);
        nni_aio_set_msg(aio,msg);
        sVar1 = nni_msg_len(msg);
        nni_aio_finish(aio,NNG_OK,sVar1);
      }
      aio = (nni_aio *)nni_list_first(&queue->readers);
    } while (aio != (nni_aio *)0x0);
  }
  return;
}

Assistant:

static void
inproc_queue_run(inproc_queue *queue)
{
	if (queue->closed) {
		inproc_queue_run_closed(queue);
	}
	for (;;) {
		nni_aio *rd;
		nni_aio *wr;
		nni_msg *msg;
		nni_msg *pu;

		if (((rd = nni_list_first(&queue->readers)) == NULL) ||
		    ((wr = nni_list_first(&queue->writers)) == NULL)) {
			return;
		}

		msg = nni_aio_get_msg(wr);
		NNI_ASSERT(msg != NULL);

		// At this point, we pass success back to the caller.  If
		// we drop the message for any reason, its accounted on the
		// receiver side.
		nni_aio_list_remove(wr);
		nni_aio_set_msg(wr, NULL);
		nni_aio_finish(
		    wr, 0, nni_msg_len(msg) + nni_msg_header_len(msg));

		// TODO: We could check the max receive size here.

		// Now the receive side.  We need to ensure that we have
		// an exclusive copy of the message, and pull the header
		// up into the body to match protocol expectations.
		if ((pu = nni_msg_pull_up(msg)) == NULL) {
			nni_msg_free(msg);
			continue;
		}
		msg = pu;

		nni_aio_list_remove(rd);
		nni_aio_set_msg(rd, msg);
		nni_aio_finish(rd, 0, nni_msg_len(msg));
	}
}